

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ElabSystemTaskSyntax::setChild
          (ElabSystemTaskSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c901c8 + *(int *)(&DAT_00c901c8 + in_RSI * 4)))();
  return;
}

Assistant:

void ElabSystemTaskSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: name = child.token(); return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}